

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupOrderDfsChoices(Gia_Man_t *p)

{
  uint uVar1;
  int iLit0;
  Gia_Man_t *p_00;
  char *pcVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs && p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x1b7,"Gia_Man_t *Gia_ManDupOrderDfsChoices(Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  piVar3 = (int *)calloc((long)p->nObjs,4);
  p_00->pNexts = piVar3;
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCi(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar1;
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ManDupOrderDfsChoices_rec
              (p_00,p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
    iLit0 = Gia_ObjFanin0Copy(pGVar4);
    uVar1 = Gia_ManAppendCo(p_00,iLit0);
    pGVar4->Value = uVar1;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupOrderDfsChoices( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs && p->pNexts );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManDupOrderDfsChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
//    Gia_ManDeriveReprs( pNew );
    return pNew;
}